

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

bool jsoncons::detail::dtoa_scientific<std::__cxx11::wstring>
               (double val,char decimal_point,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *result)

{
  int iVar1;
  wchar_t in_ESI;
  double in_XMM0_Qa;
  type_conflict1 tVar2;
  int precision2;
  int length;
  int precision;
  char buffer [100];
  chars_to to_double;
  chars_to *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  char decimal_point_00;
  size_t in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  chars_to *in_stack_ffffffffffffff90;
  bool local_1;
  
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    chars_to::chars_to(in_stack_ffffffffffffff40);
    decimal_point_00 = '\0';
    iVar1 = snprintf(&stack0xffffffffffffff58,100,"%1.*e",in_XMM0_Qa,0xf);
    if (iVar1 < 0) {
      local_1 = false;
    }
    else {
      tVar2 = chars_to::operator()
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff80);
      if (((tVar2 == in_XMM0_Qa) && (!NAN(tVar2) && !NAN(in_XMM0_Qa))) ||
         (iVar1 = snprintf(&stack0xffffffffffffff58,100,"%1.*e",in_XMM0_Qa,0x11), -1 < iVar1)) {
        dump_buffer<std::__cxx11::wstring>
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,decimal_point_00,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    chars_to::~chars_to((chars_to *)0xa12f0f);
  }
  else {
    std::__cxx11::wstring::push_back(in_ESI);
    std::__cxx11::wstring::push_back(in_ESI);
    std::__cxx11::wstring::push_back(in_ESI);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool dtoa_scientific(double val, char decimal_point, Result& result)
    {
        if (val == 0)
        {
            result.push_back('0');
            result.push_back('.');
            result.push_back('0');
            return true;
        }

        const jsoncons::detail::chars_to to_double;

        char buffer[100];
        int precision = std::numeric_limits<double>::digits10;
        int length = snprintf(buffer, sizeof(buffer), "%1.*e", precision, val);
        if (length < 0)
        {
            return false;
        }
        if (to_double(buffer, sizeof(buffer)) != val)
        {
            const int precision2 = std::numeric_limits<double>::max_digits10;
            length = snprintf(buffer, sizeof(buffer), "%1.*e", precision2, val);
            if (length < 0)
            {
                return false;
            }
        }
        dump_buffer(buffer, static_cast<std::size_t>(length), decimal_point, result);
        return true;
    }